

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void __thiscall
image_transform_png_set_scale_16_mod
          (void *this,image_pixel *that,png_const_structp pp,transform_display *display)

{
  transform_display *display_local;
  png_const_structp pp_local;
  image_pixel *that_local;
  image_transform *this_local;
  
  if (that->bit_depth == '\x10') {
    that->bit_depth = '\b';
    that->sample_depth = '\b';
    if (8 < that->red_sBIT) {
      that->red_sBIT = '\b';
    }
    if (8 < that->green_sBIT) {
      that->green_sBIT = '\b';
    }
    if (8 < that->blue_sBIT) {
      that->blue_sBIT = '\b';
    }
    if (8 < that->alpha_sBIT) {
      that->alpha_sBIT = '\b';
    }
  }
  (**(code **)(*(long *)((long)this + 0x20) + 0x38))
            (*(undefined8 *)((long)this + 0x20),that,pp,display);
  return;
}

Assistant:

static void
image_transform_png_set_scale_16_mod(const image_transform *this,
    image_pixel *that, png_const_structp pp,
    const transform_display *display)
{
   if (that->bit_depth == 16)
   {
      that->sample_depth = that->bit_depth = 8;
      if (that->red_sBIT > 8) that->red_sBIT = 8;
      if (that->green_sBIT > 8) that->green_sBIT = 8;
      if (that->blue_sBIT > 8) that->blue_sBIT = 8;
      if (that->alpha_sBIT > 8) that->alpha_sBIT = 8;
   }

   this->next->mod(this->next, that, pp, display);
}